

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_forEachFile(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  CVmNetFile *this_00;
  undefined8 *puVar4;
  undefined8 uVar5;
  long *plVar6;
  uint uVar7;
  uint recursive;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (oargc == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *oargc;
  }
  if (getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_forEachFile::desc.min_argc_ = 1;
      getp_forEachFile::desc.opt_argc_ = 1;
      getp_forEachFile::desc.varargs_ = 0;
      __cxa_guard_release(&getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_forEachFile::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.forEachFile");
    this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1004,0xb,"application/octet-stream");
    recursive = 0;
    if (1 < uVar7) {
      if (sp_[-2].typ - VM_STACK < 0xfffffffe) {
        err_throw(0x900);
      }
      recursive = (uint)(sp_[-2].typ == VM_TRUE);
    }
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(err_frame_t **)uVar5 = &err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      iVar3 = CVmNetFile::readdir_cb
                        (this_00,(this->super_CVmObject).ext_ + 8,&rc,sp_ + -1,recursive);
      if (iVar3 == 0) {
        CVmRun::throw_new_class
                  (&G_interpreter_X,G_predef_X.file_open_exc,0,"error reading directory");
      }
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    peVar1 = err_cur__.prv_;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -(long)(int)uVar7;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_forEachFile(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the READ DIR access mode */
    vm_rcdesc rc(vmg_ "FileName.forEachFile",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_FOREACHFILE, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_READDIR,
        OSFTUNK, "application/octet-stream");

    /* get the 'recursive' flag, if present */
    int recursive = FALSE;
    if (argc >= 2)
    {
        if (G_stk->get(1)->is_logical())
            recursive = G_stk->get(1)->get_logical();
        else
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    err_try
    {
        /* do the directory enumeration through the callback */
        if (!netfile->readdir_cb(vmg_ get_ext()->get_str(),
                                 &rc, G_stk->get(0), recursive))
            G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                           0, "error reading directory");
    }